

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O0

PmError alsa_in_open(PmInternal *midi,void *driverInfo)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  undefined1 *puVar4;
  PmError err_00;
  uint *ptr;
  long lVar5;
  size_t sVar6;
  undefined1 **ppuVar7;
  undefined8 uStack_60;
  undefined1 *local_58;
  undefined1 *local_50;
  PmError local_48;
  undefined1 local_42;
  undefined1 local_41;
  int err;
  snd_seq_addr_t addr;
  snd_seq_port_subscribe_t *sub;
  snd_seq_port_info_t *info;
  alsa_descriptor_type desc;
  void *client_port;
  void *driverInfo_local;
  PmInternal *midi_local;
  
  ppuVar7 = &local_58;
  pvVar3 = descriptors[midi->device_id].descriptor;
  uStack_60 = 0x1059ea;
  ptr = (uint *)pm_alloc(0x20);
  if (ptr == (uint *)0x0) {
    midi_local._4_4_ = pmInsufficientMemory;
  }
  else {
    uStack_60 = 0x105a06;
    local_48 = alsa_use_queue();
    if (~pmNoData < local_48) {
      uStack_60 = 0x105a1b;
      lVar5 = snd_seq_port_info_sizeof();
      lVar5 = -(lVar5 + 0xfU & 0xfffffffffffffff0);
      ppuVar7 = (undefined1 **)((long)&local_58 + lVar5);
      local_50 = (undefined1 *)ppuVar7;
      *(undefined8 *)((long)&uStack_60 + lVar5) = 0x105a40;
      sVar6 = snd_seq_port_info_sizeof();
      puVar4 = local_50;
      *(undefined8 *)((long)&uStack_60 + lVar5) = 0x105a4e;
      memset(puVar4,0,sVar6);
      iVar1 = midi->device_id;
      *(undefined8 *)((long)&uStack_60 + lVar5) = 0x105a5d;
      snd_seq_port_info_set_port(ppuVar7,iVar1);
      *(undefined8 *)((long)&uStack_60 + lVar5) = 0x105a6b;
      snd_seq_port_info_set_capability(ppuVar7,3);
      *(undefined8 *)((long)&uStack_60 + lVar5) = 0x105a79;
      snd_seq_port_info_set_type(ppuVar7,0x100002);
      *(undefined8 *)((long)&uStack_60 + lVar5) = 0x105a87;
      snd_seq_port_info_set_port_specified(ppuVar7,1);
      *(undefined8 *)((long)&uStack_60 + lVar5) = 0x105a97;
      local_48 = snd_seq_create_port(seq);
      if (~pmNoData < local_48) {
        midi->descriptor = ptr;
        *ptr = (uint)((ulong)pvVar3 >> 8) & 0xff;
        ptr[1] = (uint)pvVar3 & 0xff;
        ptr[2] = midi->device_id;
        ptr[3] = 0;
        ptr[6] = 0;
        *(undefined8 *)((long)&uStack_60 + lVar5) = 0x105b02;
        lVar5 = snd_seq_port_subscribe_sizeof();
        ppuVar7 = (undefined1 **)((long)ppuVar7 + -(lVar5 + 0xfU & 0xfffffffffffffff0));
        local_58 = (undefined1 *)ppuVar7;
        _err = (undefined1 *)ppuVar7;
        *(undefined8 *)((long)ppuVar7 + -8) = 0x105b27;
        sVar6 = snd_seq_port_subscribe_sizeof();
        puVar4 = local_58;
        *(undefined8 *)((long)ppuVar7 + -8) = 0x105b35;
        memset(puVar4,0,sVar6);
        *(undefined8 *)((long)ppuVar7 + -8) = 0x105b41;
        local_42 = snd_seq_client_id(seq);
        puVar4 = _err;
        local_41 = (undefined1)ptr[2];
        *(undefined8 *)((long)ppuVar7 + -8) = 0x105b5b;
        snd_seq_port_subscribe_set_dest(puVar4,&local_42);
        puVar4 = _err;
        local_42 = (undefined1)*ptr;
        local_41 = (undefined1)ptr[1];
        *(undefined8 *)((long)ppuVar7 + -8) = 0x105b7b;
        snd_seq_port_subscribe_set_sender(puVar4,&local_42);
        puVar4 = _err;
        *(undefined8 *)((long)ppuVar7 + -8) = 0x105b89;
        snd_seq_port_subscribe_set_time_update(puVar4,1);
        puVar4 = _err;
        *(undefined8 *)((long)ppuVar7 + -8) = 0x105b94;
        snd_seq_port_subscribe_set_time_real(puVar4,0);
        puVar4 = _err;
        *(undefined8 *)((long)ppuVar7 + -8) = 0x105ba4;
        local_48 = snd_seq_subscribe_port(seq,puVar4);
        if (~pmNoData < local_48) {
          return pmNoData;
        }
        uVar2 = ptr[2];
        *(undefined8 *)((long)ppuVar7 + -8) = 0x105bcb;
        snd_seq_delete_port(seq,uVar2);
      }
      *(undefined8 *)((long)ppuVar7 + -8) = 0x105bd0;
      alsa_unuse_queue();
    }
    *(undefined8 *)((long)ppuVar7 + -8) = 0x105bd9;
    pm_free(ptr);
    err_00 = local_48;
    pm_hosterror = local_48;
    if (local_48 < pmNoData) {
      *(undefined8 *)((long)ppuVar7 + -8) = 0x105bff;
      get_alsa_error_text(pm_hosterror_text,0x100,err_00);
    }
    midi_local._4_4_ = pmHostError;
  }
  return midi_local._4_4_;
}

Assistant:

static PmError alsa_in_open(PmInternal *midi, void *driverInfo)
{
    void *client_port = descriptors[midi->device_id].descriptor;
    alsa_descriptor_type desc = (alsa_descriptor_type) 
        pm_alloc(sizeof(alsa_descriptor_node));
    snd_seq_port_info_t *info;
    snd_seq_port_subscribe_t *sub;
    snd_seq_addr_t addr;
    int err;

    if (!desc) return pmInsufficientMemory;
    
    err = alsa_use_queue();
    if (err < 0) goto free_desc;

    snd_seq_port_info_alloca(&info);
    snd_seq_port_info_set_port(info, midi->device_id);
    snd_seq_port_info_set_capability(info, SND_SEQ_PORT_CAP_WRITE |
                                     SND_SEQ_PORT_CAP_READ);
    snd_seq_port_info_set_type(info, SND_SEQ_PORT_TYPE_MIDI_GENERIC | 
                                     SND_SEQ_PORT_TYPE_APPLICATION);
    snd_seq_port_info_set_port_specified(info, 1);
    err = snd_seq_create_port(seq, info);
    if (err < 0) goto free_queue;

    /* fill in fields of desc, which is passed to pm_write routines */
    midi->descriptor = desc;
    desc->client = GET_DESCRIPTOR_CLIENT(client_port);
    desc->port = GET_DESCRIPTOR_PORT(client_port);
    desc->this_port = midi->device_id;
    desc->in_sysex = 0;

    desc->error = 0;

    VERBOSE printf("snd_seq_connect_from: %d %d %d\n", 
                   desc->this_port, desc->client, desc->port);
    snd_seq_port_subscribe_alloca(&sub);
    addr.client = snd_seq_client_id(seq);
    addr.port = desc->this_port;
    snd_seq_port_subscribe_set_dest(sub, &addr);
    addr.client = desc->client;
    addr.port = desc->port;
    snd_seq_port_subscribe_set_sender(sub, &addr);
    snd_seq_port_subscribe_set_time_update(sub, 1);
    /* this doesn't seem to work: messages come in with real timestamps */
    snd_seq_port_subscribe_set_time_real(sub, 0);
    err = snd_seq_subscribe_port(seq, sub);
    /* err = 
       snd_seq_connect_from(seq, desc->this_port, desc->client, desc->port); */
    if (err < 0) goto free_this_port;  /* clean up and return on error */
    return pmNoError;

 free_this_port:
    snd_seq_delete_port(seq, desc->this_port);
 free_queue:
    alsa_unuse_queue();
 free_desc:
    pm_free(desc);
    pm_hosterror = err;
    if (err < 0) {
        get_alsa_error_text(pm_hosterror_text, PM_HOST_ERROR_MSG_LEN, err);
    }
    return pmHostError;
}